

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitReferenceExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,ReferenceExpr *expr)

{
  bool bVar1;
  Token *pTVar2;
  type expr_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  byte local_11a;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  byte local_e2;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ReferenceExpr *local_20;
  ReferenceExpr *expr_local;
  AstSerialise *this_local;
  
  local_20 = expr;
  expr_local = (ReferenceExpr *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&expr->permission);
  local_e2 = 0;
  if (bVar1) {
    pTVar2 = std::optional<enact::Token>::operator->(&local_20->permission);
    std::__cxx11::string::string((string *)&local_e0,(string *)&pTVar2->lexeme);
  }
  else {
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
  }
  std::operator+(&local_c0,"(&",&local_e0);
  std::operator+(&local_a0,&local_c0," ");
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_20->region);
  local_11a = 0;
  if (bVar1) {
    pTVar2 = std::optional<enact::Token>::operator->(&local_20->region);
    std::__cxx11::string::string((string *)&local_118,(string *)&pTVar2->lexeme);
  }
  else {
    std::allocator<char>::allocator();
    local_11a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
  }
  std::operator+(&local_80,&local_a0,&local_118);
  std::operator+(&local_60,&local_80," ");
  expr_00 = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*
                      (&local_20->expr);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_140,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,expr_00);
  std::operator+(&local_40,&local_60,&local_140);
  std::operator+(__return_storage_ptr__,&local_40,")");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_118);
  if ((local_11a & 1) != 0) {
    std::allocator<char>::~allocator(&local_119);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_e1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitReferenceExpr(ReferenceExpr &expr) {
        return "(&" +
                (expr.permission ? expr.permission->lexeme : "") + " " +
                (expr.region ? expr.region->lexeme : "") + " " +
                visitExpr(*expr.expr) + ")";
    }